

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

bool google::protobuf::compiler::ruby::MaybeEmitDependency
               (FileDescriptor *import,FileDescriptor *from,Printer *printer,string *error)

{
  bool bVar1;
  LogMessage *pLVar2;
  long lVar3;
  long lVar4;
  LogFinisher local_81;
  string local_80;
  LogMessage local_60;
  
  if (*(int *)(import + 0x8c) == 2) {
    lVar4 = -1;
    lVar3 = 0;
    do {
      lVar4 = lVar4 + 1;
      if (*(int *)(from + 0x58) <= lVar4) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                   ,0x1a8);
        pLVar2 = internal::LogMessage::operator<<(&local_60,"Omitting proto2 dependency \'");
        pLVar2 = internal::LogMessage::operator<<(pLVar2,*(string **)import);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,"\' from proto3 output file \'");
        GetOutputFilename(&local_80,*(string **)from);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_80);
        pLVar2 = internal::LogMessage::operator<<
                           (pLVar2,
                            "\' because we don\'t support proto2 and no proto2 types from that file are being used."
                           );
        internal::LogFinisher::operator=(&local_81,pLVar2);
        std::__cxx11::string::~string((string *)&local_80);
        internal::LogMessage::~LogMessage(&local_60);
        goto LAB_00271216;
      }
      bVar1 = UsesTypeFromFile((Descriptor *)(lVar3 + *(long *)(from + 0x60)),import,error);
      lVar3 = lVar3 + 0xa8;
    } while (!bVar1);
    bVar1 = false;
  }
  else {
    GetRequireName((string *)&local_60,*(string **)import);
    io::Printer::Print(printer,"require \'$name$\'\n","name",(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
LAB_00271216:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool MaybeEmitDependency(const FileDescriptor* import,
                         const FileDescriptor* from,
                         io::Printer* printer,
                         string* error) {
  if (import->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    for (int i = 0; i < from->message_type_count(); i++) {
      if (UsesTypeFromFile(from->message_type(i), import, error)) {
        // Error text was already set by UsesTypeFromFile().
        return false;
      }
    }

    // Ok to omit this proto2 dependency -- so we won't print anything.
    GOOGLE_LOG(WARNING) << "Omitting proto2 dependency '" << import->name()
                        << "' from proto3 output file '"
                        << GetOutputFilename(from->name())
                        << "' because we don't support proto2 and no proto2 "
                           "types from that file are being used.";
    return true;
  } else {
    printer->Print(
      "require '$name$'\n", "name", GetRequireName(import->name()));
    return true;
  }
}